

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O1

string_type * __thiscall
booster::locale::basic_message<wchar_t>::str_abi_cxx11_
          (string_type *__return_storage_ptr__,basic_message<wchar_t> *this,locale *loc,int id)

{
  wchar_t *pwVar1;
  wchar_t *__s;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  __s = (wchar_t *)write(this,(int)loc,(void *)(ulong)(uint)id,(size_t)__return_storage_ptr__);
  if (__s != (__return_storage_ptr__->_M_dataplus)._M_p) {
    pwVar1 = (wchar_t *)__return_storage_ptr__->_M_string_length;
    wcslen(__s);
    std::__cxx11::wstring::_M_replace((ulong)__return_storage_ptr__,0,pwVar1,(ulong)__s);
  }
  return __return_storage_ptr__;
}

Assistant:

string_type str(std::locale const &loc,int id) const
            {
                string_type buffer;                
                char_type const *ptr = write(loc,id,buffer);
                if(ptr == buffer.c_str())
                    return buffer;
                else
                    buffer = ptr;
                return buffer;
            }